

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_pubkey_create_helper
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_scalar *seckey_scalar,
              secp256k1_ge *p,uchar *seckey)

{
  ulong uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  int vflag;
  unsigned_long _zzq_result;
  secp256k1_gej pj;
  uint local_108;
  secp256k1_gej local_c8;
  
  uVar2 = secp256k1_scalar_set_b32_seckey(seckey_scalar,seckey);
  local_108 = uVar2 ^ 1;
  secp256k1_scalar_verify(&secp256k1_scalar_one);
  local_c8.x.n[0] = 0x4d430005;
  local_c8.x.n[2] = 0x20;
  local_c8.x.n[3] = 0;
  local_c8.x.n[4] = 0;
  local_c8.x.magnitude = 0;
  local_c8.x.normalized = 0;
  uVar1 = (long)(int)local_108 - 1;
  seckey_scalar->d[0] = (ulong)(local_108 & 1) | seckey_scalar->d[0] & uVar1;
  auVar3._8_4_ = (int)uVar1;
  auVar3._0_8_ = uVar1;
  auVar3._12_4_ = (int)(uVar1 >> 0x20);
  *(undefined1 (*) [16])(seckey_scalar->d + 1) =
       auVar3 & *(undefined1 (*) [16])(seckey_scalar->d + 1);
  seckey_scalar->d[3] = seckey_scalar->d[3] & uVar1;
  local_c8.x.n[1] = (uint64_t)seckey_scalar;
  secp256k1_scalar_verify(seckey_scalar);
  secp256k1_ecmult_gen(ecmult_gen_ctx,&local_c8,seckey_scalar);
  secp256k1_ge_set_gej(p,&local_c8);
  memset(&local_c8,0,0x98);
  return uVar2;
}

Assistant:

static int secp256k1_ec_pubkey_create_helper(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_scalar *seckey_scalar, secp256k1_ge *p, const unsigned char *seckey) {
    secp256k1_gej pj;
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(seckey_scalar, seckey);
    secp256k1_scalar_cmov(seckey_scalar, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(ecmult_gen_ctx, &pj, seckey_scalar);
    secp256k1_ge_set_gej(p, &pj);
    secp256k1_gej_clear(&pj);
    return ret;
}